

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float *pfVar4;
  int iVar5;
  size_t sVar6;
  undefined8 uVar7;
  Scene *pSVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  int iVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  long lVar27;
  Geometry *pGVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  Geometry *pGVar37;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar38;
  ulong uVar39;
  ulong unaff_R12;
  size_t mask;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  float fVar43;
  uint uVar44;
  float fVar45;
  float fVar62;
  float fVar65;
  vint4 bi;
  uint uVar63;
  uint uVar66;
  float fVar68;
  uint uVar69;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar64;
  float fVar67;
  float fVar70;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar61;
  float fVar71;
  int iVar80;
  int iVar82;
  vint4 bi_1;
  float fVar81;
  float fVar83;
  int iVar84;
  float fVar85;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar86;
  uint uVar87;
  float fVar88;
  float fVar92;
  float fVar95;
  vint4 ai;
  uint uVar93;
  uint uVar96;
  float fVar98;
  uint uVar99;
  StackItemT<embree::NodeRefPtr<4>_> SVar89;
  float fVar94;
  float fVar97;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar106;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar125;
  float fVar126;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar119;
  float fVar127;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  StackItemT<embree::NodeRefPtr<4>_> *pSStack_1290;
  undefined8 local_1278;
  vbool<4> valid;
  undefined8 local_1218;
  undefined8 uStack_1210;
  long local_1208;
  ulong local_1200;
  ulong local_11f8;
  ulong local_11f0;
  StackItemT<embree::NodeRefPtr<4>_> *local_11e8;
  RTCFilterFunctionNArguments args;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  vfloat<4> tNear;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  float local_10e8 [4];
  float local_10d8 [4];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [8];
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined4 local_1068;
  undefined4 uStack_1064;
  undefined4 uStack_1060;
  undefined4 uStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  int local_fe8;
  int iStack_fe4;
  int iStack_fe0;
  int iStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar134;
  
  pSVar38 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_f88 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_f98 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fa8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fb8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = uVar33 ^ 0x10;
  uVar41 = uVar34 ^ 0x10;
  uVar40 = uVar35 ^ 0x10;
  local_fe8 = (tray->tnear).field_0.i[k];
  iVar24 = (tray->tfar).field_0.i[k];
  local_ff8 = mm_lookupmask_ps._0_8_;
  uStack_ff0 = mm_lookupmask_ps._8_8_;
  local_1008 = mm_lookupmask_ps._240_8_;
  uStack_1000 = mm_lookupmask_ps._248_8_;
  lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  iStack_fe4 = local_fe8;
  iStack_fe0 = local_fe8;
  iStack_fdc = local_fe8;
  fVar153 = local_f88;
  fVar134 = local_f88;
  fVar147 = local_f88;
  fVar154 = local_f88;
  fVar116 = local_f98;
  fVar125 = local_f98;
  fVar126 = local_f98;
  fVar127 = local_f98;
  fVar135 = local_fa8;
  fVar137 = local_fa8;
  fVar138 = local_fa8;
  fVar139 = local_fa8;
  fVar45 = local_fb8;
  fVar64 = local_fb8;
  fVar67 = local_fb8;
  fVar70 = local_fb8;
  iVar80 = iVar24;
  iVar82 = iVar24;
  iVar84 = iVar24;
  iVar106 = local_fe8;
  iVar113 = local_fe8;
  iVar114 = local_fe8;
  iVar115 = local_fe8;
  fVar71 = local_fc8;
  fVar81 = local_fc8;
  fVar83 = local_fc8;
  fVar85 = local_fc8;
  fVar88 = local_fd8;
  fVar94 = local_fd8;
  fVar97 = local_fd8;
  fVar100 = local_fd8;
  do {
    do {
      do {
        pSStack_1290 = stack;
        if (pSVar38 == pSStack_1290) {
          return;
        }
        pSVar23 = pSVar38 + -1;
        pSVar38 = pSVar38 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar23->dist &&
               (float)pSVar23->dist != *(float *)(ray + k * 4 + 0x80));
      sVar32 = (pSVar38->ptr).ptr;
      do {
        if ((sVar32 & 8) == 0) {
          pfVar2 = (float *)(sVar32 + 0x20 + uVar33);
          fVar43 = (*pfVar2 - fVar153) * fVar45;
          fVar62 = (pfVar2[1] - fVar134) * fVar64;
          fVar65 = (pfVar2[2] - fVar147) * fVar67;
          fVar68 = (pfVar2[3] - fVar154) * fVar70;
          pfVar2 = (float *)(sVar32 + 0x20 + uVar34);
          fVar86 = (*pfVar2 - fVar116) * fVar71;
          fVar92 = (pfVar2[1] - fVar125) * fVar81;
          fVar95 = (pfVar2[2] - fVar126) * fVar83;
          fVar98 = (pfVar2[3] - fVar127) * fVar85;
          uVar87 = (uint)((int)fVar86 < (int)fVar43) * (int)fVar43 |
                   (uint)((int)fVar86 >= (int)fVar43) * (int)fVar86;
          uVar93 = (uint)((int)fVar92 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar92 >= (int)fVar62) * (int)fVar92;
          uVar96 = (uint)((int)fVar95 < (int)fVar65) * (int)fVar65 |
                   (uint)((int)fVar95 >= (int)fVar65) * (int)fVar95;
          uVar99 = (uint)((int)fVar98 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar98 >= (int)fVar68) * (int)fVar98;
          pfVar2 = (float *)(sVar32 + 0x20 + uVar35);
          fVar43 = (*pfVar2 - fVar135) * fVar88;
          fVar62 = (pfVar2[1] - fVar137) * fVar94;
          fVar65 = (pfVar2[2] - fVar138) * fVar97;
          fVar68 = (pfVar2[3] - fVar139) * fVar100;
          uVar44 = (uint)((int)fVar43 < iVar106) * iVar106 |
                   (uint)((int)fVar43 >= iVar106) * (int)fVar43;
          uVar63 = (uint)((int)fVar62 < iVar113) * iVar113 |
                   (uint)((int)fVar62 >= iVar113) * (int)fVar62;
          uVar66 = (uint)((int)fVar65 < iVar114) * iVar114 |
                   (uint)((int)fVar65 >= iVar114) * (int)fVar65;
          uVar69 = (uint)((int)fVar68 < iVar115) * iVar115 |
                   (uint)((int)fVar68 >= iVar115) * (int)fVar68;
          tNear.field_0.i[0] =
               ((int)uVar44 < (int)uVar87) * uVar87 | ((int)uVar44 >= (int)uVar87) * uVar44;
          tNear.field_0.i[1] =
               ((int)uVar63 < (int)uVar93) * uVar93 | ((int)uVar63 >= (int)uVar93) * uVar63;
          tNear.field_0.i[2] =
               ((int)uVar66 < (int)uVar96) * uVar96 | ((int)uVar66 >= (int)uVar96) * uVar66;
          tNear.field_0.i[3] =
               ((int)uVar69 < (int)uVar99) * uVar99 | ((int)uVar69 >= (int)uVar99) * uVar69;
          pfVar2 = (float *)(sVar32 + 0x20 + uVar39);
          fVar43 = (*pfVar2 - fVar153) * fVar45;
          fVar62 = (pfVar2[1] - fVar134) * fVar64;
          fVar65 = (pfVar2[2] - fVar147) * fVar67;
          fVar68 = (pfVar2[3] - fVar154) * fVar70;
          pfVar2 = (float *)(sVar32 + 0x20 + uVar41);
          fVar86 = (*pfVar2 - fVar116) * fVar71;
          fVar92 = (pfVar2[1] - fVar125) * fVar81;
          fVar95 = (pfVar2[2] - fVar126) * fVar83;
          fVar98 = (pfVar2[3] - fVar127) * fVar85;
          uVar87 = (uint)((int)fVar43 < (int)fVar86) * (int)fVar43 |
                   (uint)((int)fVar43 >= (int)fVar86) * (int)fVar86;
          uVar93 = (uint)((int)fVar62 < (int)fVar92) * (int)fVar62 |
                   (uint)((int)fVar62 >= (int)fVar92) * (int)fVar92;
          uVar96 = (uint)((int)fVar65 < (int)fVar95) * (int)fVar65 |
                   (uint)((int)fVar65 >= (int)fVar95) * (int)fVar95;
          uVar99 = (uint)((int)fVar68 < (int)fVar98) * (int)fVar68 |
                   (uint)((int)fVar68 >= (int)fVar98) * (int)fVar98;
          pfVar2 = (float *)(sVar32 + 0x20 + uVar40);
          fVar43 = (*pfVar2 - fVar135) * fVar88;
          fVar62 = (pfVar2[1] - fVar137) * fVar94;
          fVar65 = (pfVar2[2] - fVar138) * fVar97;
          fVar68 = (pfVar2[3] - fVar139) * fVar100;
          uVar44 = (uint)(iVar24 < (int)fVar43) * iVar24 |
                   (uint)(iVar24 >= (int)fVar43) * (int)fVar43;
          uVar63 = (uint)(iVar80 < (int)fVar62) * iVar80 |
                   (uint)(iVar80 >= (int)fVar62) * (int)fVar62;
          uVar66 = (uint)(iVar82 < (int)fVar65) * iVar82 |
                   (uint)(iVar82 >= (int)fVar65) * (int)fVar65;
          uVar69 = (uint)(iVar84 < (int)fVar68) * iVar84 |
                   (uint)(iVar84 >= (int)fVar68) * (int)fVar68;
          auVar123._0_4_ =
               -(uint)((int)(((int)uVar87 < (int)uVar44) * uVar87 |
                            ((int)uVar87 >= (int)uVar44) * uVar44) < tNear.field_0.i[0]);
          auVar123._4_4_ =
               -(uint)((int)(((int)uVar93 < (int)uVar63) * uVar93 |
                            ((int)uVar93 >= (int)uVar63) * uVar63) < tNear.field_0.i[1]);
          auVar123._8_4_ =
               -(uint)((int)(((int)uVar96 < (int)uVar66) * uVar96 |
                            ((int)uVar96 >= (int)uVar66) * uVar66) < tNear.field_0.i[2]);
          auVar123._12_4_ =
               -(uint)((int)(((int)uVar99 < (int)uVar69) * uVar99 |
                            ((int)uVar99 >= (int)uVar69) * uVar69) < tNear.field_0.i[3]);
          uVar44 = movmskps((int)pSStack_1290,auVar123);
          unaff_R12 = ((ulong)uVar44 ^ 0xf) & 0xff;
        }
        if ((sVar32 & 8) == 0) {
          if (unaff_R12 == 0) {
            pSStack_1290 = (StackItemT<embree::NodeRefPtr<4>_> *)0x4;
          }
          else {
            uVar31 = sVar32 & 0xfffffffffffffff0;
            lVar30 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            pSStack_1290 = (StackItemT<embree::NodeRefPtr<4>_> *)0x0;
            sVar32 = *(size_t *)(uVar31 + lVar30 * 8);
            uVar36 = unaff_R12 - 1 & unaff_R12;
            if (uVar36 != 0) {
              uVar44 = tNear.field_0.i[lVar30];
              lVar30 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              sVar6 = *(size_t *)(uVar31 + lVar30 * 8);
              uVar63 = tNear.field_0.i[lVar30];
              uVar36 = uVar36 - 1 & uVar36;
              if (uVar36 == 0) {
                if (uVar44 < uVar63) {
                  (pSVar38->ptr).ptr = sVar6;
                  pSVar38->dist = uVar63;
                  pSVar38 = pSVar38 + 1;
                }
                else {
                  (pSVar38->ptr).ptr = sVar32;
                  pSVar38->dist = uVar44;
                  sVar32 = sVar6;
                  pSVar38 = pSVar38 + 1;
                }
              }
              else {
                auVar112._8_4_ = uVar44;
                auVar112._0_8_ = sVar32;
                auVar112._12_4_ = 0;
                auVar118._8_4_ = uVar63;
                auVar118._0_8_ = sVar6;
                auVar118._12_4_ = 0;
                lVar30 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                uVar7 = *(undefined8 *)(uVar31 + lVar30 * 8);
                iVar5 = tNear.field_0.i[lVar30];
                auVar129._8_4_ = iVar5;
                auVar129._0_8_ = uVar7;
                auVar129._12_4_ = 0;
                auVar109._8_4_ = -(uint)((int)uVar44 < (int)uVar63);
                uVar36 = uVar36 - 1 & uVar36;
                if (uVar36 == 0) {
                  auVar109._4_4_ = auVar109._8_4_;
                  auVar109._0_4_ = auVar109._8_4_;
                  auVar109._12_4_ = auVar109._8_4_;
                  auVar107._8_4_ = uVar63;
                  auVar107._0_8_ = sVar6;
                  auVar107._12_4_ = 0;
                  auVar108 = blendvps(auVar107,auVar112,auVar109);
                  auVar123 = blendvps(auVar112,auVar118,auVar109);
                  auVar46._8_4_ = -(uint)(auVar108._8_4_ < iVar5);
                  auVar46._4_4_ = auVar46._8_4_;
                  auVar46._0_4_ = auVar46._8_4_;
                  auVar46._12_4_ = auVar46._8_4_;
                  auVar117._8_4_ = iVar5;
                  auVar117._0_8_ = uVar7;
                  auVar117._12_4_ = 0;
                  auVar118 = blendvps(auVar117,auVar108,auVar46);
                  auVar112 = blendvps(auVar108,auVar129,auVar46);
                  auVar47._8_4_ = -(uint)(auVar123._8_4_ < auVar112._8_4_);
                  auVar47._4_4_ = auVar47._8_4_;
                  auVar47._0_4_ = auVar47._8_4_;
                  auVar47._12_4_ = auVar47._8_4_;
                  SVar101 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar112,auVar123,auVar47);
                  SVar89 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar123,auVar112,auVar47);
                  *pSVar38 = SVar89;
                  pSVar38[1] = SVar101;
                  sVar32 = auVar118._0_8_;
                  pSVar38 = pSVar38 + 2;
                }
                else {
                  lVar30 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  auVar108._4_4_ = auVar109._8_4_;
                  auVar108._0_4_ = auVar109._8_4_;
                  auVar108._8_4_ = auVar109._8_4_;
                  auVar108._12_4_ = auVar109._8_4_;
                  auVar109 = blendvps(auVar118,auVar112,auVar108);
                  auVar123 = blendvps(auVar112,auVar118,auVar108);
                  auVar128._8_4_ = tNear.field_0.i[lVar30];
                  auVar128._0_8_ = *(undefined8 *)(uVar31 + lVar30 * 8);
                  auVar128._12_4_ = 0;
                  auVar48._8_4_ = -(uint)(iVar5 < tNear.field_0.i[lVar30]);
                  auVar48._4_4_ = auVar48._8_4_;
                  auVar48._0_4_ = auVar48._8_4_;
                  auVar48._12_4_ = auVar48._8_4_;
                  auVar118 = blendvps(auVar128,auVar129,auVar48);
                  auVar112 = blendvps(auVar129,auVar128,auVar48);
                  auVar49._8_4_ = -(uint)(auVar123._8_4_ < auVar112._8_4_);
                  auVar49._4_4_ = auVar49._8_4_;
                  auVar49._0_4_ = auVar49._8_4_;
                  auVar49._12_4_ = auVar49._8_4_;
                  auVar129 = blendvps(auVar112,auVar123,auVar49);
                  SVar89 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar123,auVar112,auVar49);
                  auVar50._8_4_ = -(uint)(auVar109._8_4_ < auVar118._8_4_);
                  auVar50._4_4_ = auVar50._8_4_;
                  auVar50._0_4_ = auVar50._8_4_;
                  auVar50._12_4_ = auVar50._8_4_;
                  auVar123 = blendvps(auVar118,auVar109,auVar50);
                  auVar112 = blendvps(auVar109,auVar118,auVar50);
                  auVar51._8_4_ = -(uint)(auVar112._8_4_ < auVar129._8_4_);
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  SVar119 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar129,auVar112,auVar51);
                  SVar101 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar112,auVar129,auVar51);
                  *pSVar38 = SVar89;
                  pSVar38[1] = SVar101;
                  pSVar38[2] = SVar119;
                  sVar32 = auVar123._0_8_;
                  pSVar38 = pSVar38 + 3;
                }
              }
            }
          }
        }
        else {
          pSStack_1290 = (StackItemT<embree::NodeRefPtr<4>_> *)0x6;
        }
      } while ((int)pSStack_1290 == 0);
    } while ((int)pSStack_1290 != 6);
    lVar30 = (ulong)((uint)sVar32 & 0xf) - 8;
    if (lVar30 != 0) {
      uVar31 = sVar32 & 0xfffffffffffffff0;
      lVar42 = 0;
      do {
        lVar27 = lVar42 * 0xe0;
        puVar3 = (undefined8 *)(uVar31 + 0xd0 + lVar27);
        local_11a8 = *puVar3;
        uStack_11a0 = puVar3[1];
        pfVar2 = (float *)(uVar31 + lVar27);
        fVar116 = *pfVar2;
        fVar125 = pfVar2[1];
        fVar126 = pfVar2[2];
        fVar127 = pfVar2[3];
        pfVar2 = (float *)(uVar31 + 0x10 + lVar27);
        fVar135 = *pfVar2;
        fVar137 = pfVar2[1];
        fVar138 = pfVar2[2];
        fVar139 = pfVar2[3];
        pfVar2 = (float *)(uVar31 + 0x20 + lVar27);
        fVar45 = *pfVar2;
        fVar64 = pfVar2[1];
        fVar67 = pfVar2[2];
        fVar70 = pfVar2[3];
        pfVar2 = (float *)(uVar31 + 0x30 + lVar27);
        fVar71 = fVar116 - *pfVar2;
        fVar81 = fVar125 - pfVar2[1];
        fVar83 = fVar126 - pfVar2[2];
        fVar85 = fVar127 - pfVar2[3];
        pfVar4 = (float *)(uVar31 + 0x90 + lVar27);
        pfVar2 = (float *)(uVar31 + 0x40 + lVar27);
        fVar43 = fVar135 - *pfVar2;
        fVar62 = fVar137 - pfVar2[1];
        fVar65 = fVar138 - pfVar2[2];
        fVar68 = fVar139 - pfVar2[3];
        pfVar2 = (float *)(uVar31 + 0x50 + lVar27);
        fVar152 = fVar45 - *pfVar2;
        fVar155 = fVar64 - pfVar2[1];
        fVar157 = fVar67 - pfVar2[2];
        fVar159 = fVar70 - pfVar2[3];
        fVar88 = *pfVar4 - fVar116;
        fVar94 = pfVar4[1] - fVar125;
        fVar97 = pfVar4[2] - fVar126;
        fVar100 = pfVar4[3] - fVar127;
        pfVar2 = (float *)(uVar31 + 0xa0 + lVar27);
        fVar140 = *pfVar2 - fVar135;
        fVar141 = pfVar2[1] - fVar137;
        fVar142 = pfVar2[2] - fVar138;
        fVar143 = pfVar2[3] - fVar139;
        pfVar2 = (float *)(uVar31 + 0xb0 + lVar27);
        fVar148 = *pfVar2 - fVar45;
        fVar149 = pfVar2[1] - fVar64;
        fVar150 = pfVar2[2] - fVar67;
        fVar151 = pfVar2[3] - fVar70;
        local_10d8[0] = fVar152 * fVar140 - fVar43 * fVar148;
        local_10d8[1] = fVar155 * fVar141 - fVar62 * fVar149;
        local_10d8[2] = fVar157 * fVar142 - fVar65 * fVar150;
        local_10d8[3] = fVar159 * fVar143 - fVar68 * fVar151;
        fVar153 = *(float *)(ray + k * 4);
        fVar134 = *(float *)(ray + k * 4 + 0x10);
        fVar147 = *(float *)(ray + k * 4 + 0x40);
        fVar154 = *(float *)(ray + k * 4 + 0x50);
        fVar116 = fVar116 - fVar153;
        fVar125 = fVar125 - fVar153;
        fVar126 = fVar126 - fVar153;
        fVar127 = fVar127 - fVar153;
        fVar135 = fVar135 - fVar134;
        fVar137 = fVar137 - fVar134;
        fVar138 = fVar138 - fVar134;
        fVar139 = fVar139 - fVar134;
        fVar161 = fVar116 * fVar154 - fVar135 * fVar147;
        fVar162 = fVar125 * fVar154 - fVar137 * fVar147;
        fVar163 = fVar126 * fVar154 - fVar138 * fVar147;
        fVar164 = fVar127 * fVar154 - fVar139 * fVar147;
        fVar86 = fVar71 * fVar148 - fVar152 * fVar88;
        fVar92 = fVar81 * fVar149 - fVar155 * fVar94;
        fVar95 = fVar83 * fVar150 - fVar157 * fVar97;
        fVar98 = fVar85 * fVar151 - fVar159 * fVar100;
        fVar153 = *(float *)(ray + k * 4 + 0x20);
        fVar134 = *(float *)(ray + k * 4 + 0x60);
        fVar45 = fVar45 - fVar153;
        fVar64 = fVar64 - fVar153;
        fVar67 = fVar67 - fVar153;
        fVar70 = fVar70 - fVar153;
        fVar165 = fVar45 * fVar147 - fVar116 * fVar134;
        fVar166 = fVar64 * fVar147 - fVar125 * fVar134;
        fVar167 = fVar67 * fVar147 - fVar126 * fVar134;
        fVar168 = fVar70 * fVar147 - fVar127 * fVar134;
        local_10b8._0_4_ = fVar43 * fVar88 - fVar71 * fVar140;
        local_10b8._4_4_ = fVar62 * fVar94 - fVar81 * fVar141;
        fStack_10b0 = fVar65 * fVar97 - fVar83 * fVar142;
        fStack_10ac = fVar68 * fVar100 - fVar85 * fVar143;
        fVar153 = fVar135 * fVar134 - fVar45 * fVar154;
        fVar156 = fVar137 * fVar134 - fVar64 * fVar154;
        fVar158 = fVar138 * fVar134 - fVar67 * fVar154;
        fVar160 = fVar139 * fVar134 - fVar70 * fVar154;
        local_1278 = CONCAT44(fVar92,fVar86);
        fVar144 = fVar147 * local_10d8[0] + fVar154 * fVar86 + fVar134 * (float)local_10b8._0_4_;
        fVar145 = fVar147 * local_10d8[1] + fVar154 * fVar92 + fVar134 * (float)local_10b8._4_4_;
        fVar146 = fVar147 * local_10d8[2] + fVar154 * fVar95 + fVar134 * fStack_10b0;
        fVar147 = fVar147 * local_10d8[3] + fVar154 * fVar98 + fVar134 * fStack_10ac;
        uVar63 = (uint)fVar144 & 0x80000000;
        uVar66 = (uint)fVar145 & 0x80000000;
        uVar69 = (uint)fVar146 & 0x80000000;
        uVar87 = (uint)fVar147 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar88 * fVar153 + fVar140 * fVar165 + fVar148 * fVar161) ^ uVar63;
        tNear.field_0.i[1] =
             (uint)(fVar94 * fVar156 + fVar141 * fVar166 + fVar149 * fVar162) ^ uVar66;
        tNear.field_0.i[2] =
             (uint)(fVar97 * fVar158 + fVar142 * fVar167 + fVar150 * fVar163) ^ uVar69;
        tNear.field_0.i[3] =
             (uint)(fVar100 * fVar160 + fVar143 * fVar168 + fVar151 * fVar164) ^ uVar87;
        fVar154 = (float)((uint)(fVar153 * fVar71 + fVar165 * fVar43 + fVar161 * fVar152) ^ uVar63);
        fVar71 = (float)((uint)(fVar156 * fVar81 + fVar166 * fVar62 + fVar162 * fVar155) ^ uVar66);
        fVar81 = (float)((uint)(fVar158 * fVar83 + fVar167 * fVar65 + fVar163 * fVar157) ^ uVar69);
        fVar83 = (float)((uint)(fVar160 * fVar85 + fVar168 * fVar68 + fVar164 * fVar159) ^ uVar87);
        auVar120._0_12_ = ZEXT812(0);
        auVar120._12_4_ = 0;
        fVar153 = ABS(fVar144);
        fVar134 = ABS(fVar145);
        auVar130._0_8_ = CONCAT44(fVar145,fVar144) & 0x7fffffff7fffffff;
        auVar130._8_4_ = ABS(fVar146);
        auVar130._12_4_ = ABS(fVar147);
        bVar17 = ((0.0 <= fVar154 && 0.0 <= tNear.field_0.v[0]) && fVar144 != 0.0) &&
                 tNear.field_0.v[0] + fVar154 <= fVar153;
        bVar18 = ((0.0 <= fVar71 && 0.0 <= tNear.field_0.v[1]) && fVar145 != 0.0) &&
                 tNear.field_0.v[1] + fVar71 <= fVar134;
        bVar16 = ((0.0 <= fVar81 && 0.0 <= tNear.field_0.v[2]) && fVar146 != 0.0) &&
                 tNear.field_0.v[2] + fVar81 <= auVar130._8_4_;
        bVar15 = ((0.0 <= fVar83 && 0.0 <= tNear.field_0.v[3]) && fVar147 != 0.0) &&
                 tNear.field_0.v[3] + fVar83 <= auVar130._12_4_;
        lVar1 = lVar27 + uVar31;
        auVar10._4_4_ = -(uint)bVar18;
        auVar10._0_4_ = -(uint)bVar17;
        auVar10._8_4_ = -(uint)bVar16;
        auVar10._12_4_ = -(uint)bVar15;
        uVar44 = movmskps((int)lVar27,auVar10);
        uVar26 = (undefined4)((ulong)context >> 0x20);
        if (uVar44 != 0) {
          fVar135 = (float)(uVar63 ^ (uint)(fVar116 * local_10d8[0] +
                                           fVar135 * fVar86 + fVar45 * (float)local_10b8._0_4_));
          fVar125 = (float)(uVar66 ^ (uint)(fVar125 * local_10d8[1] +
                                           fVar137 * fVar92 + fVar64 * (float)local_10b8._4_4_));
          fVar126 = (float)(uVar69 ^ (uint)(fVar126 * local_10d8[2] +
                                           fVar138 * fVar95 + fVar67 * fStack_10b0));
          fVar127 = (float)(uVar87 ^ (uint)(fVar127 * local_10d8[3] +
                                           fVar139 * fVar98 + fVar70 * fStack_10ac));
          fVar147 = *(float *)(ray + k * 4 + 0x30);
          fVar116 = *(float *)(ray + k * 4 + 0x80);
          bVar17 = (fVar147 * fVar153 < fVar135 && fVar135 <= fVar116 * fVar153) && bVar17;
          bVar18 = (fVar147 * fVar134 < fVar125 && fVar125 <= fVar116 * fVar134) && bVar18;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar18,-(uint)bVar17);
          bVar16 = (fVar147 * auVar130._8_4_ < fVar126 && fVar126 <= fVar116 * auVar130._8_4_) &&
                   bVar16;
          valid.field_0.i[2] = -(uint)bVar16;
          bVar15 = (fVar147 * auVar130._12_4_ < fVar127 && fVar127 <= fVar116 * auVar130._12_4_) &&
                   bVar15;
          valid.field_0.i[3] = -(uint)bVar15;
          uVar44 = movmskps(uVar44,(undefined1  [16])valid.field_0);
          if (uVar44 != 0) {
            local_10a8._8_8_ = uStack_ff0;
            local_10a8._0_8_ = local_ff8;
            pSVar8 = context->scene;
            auVar123 = rcpps(auVar120,auVar130);
            fVar147 = auVar123._0_4_;
            fVar116 = auVar123._4_4_;
            fVar138 = auVar123._8_4_;
            fVar139 = auVar123._12_4_;
            fVar45 = (float)DAT_01feca10;
            fVar64 = DAT_01feca10._4_4_;
            fVar67 = DAT_01feca10._12_4_;
            fVar137 = DAT_01feca10._8_4_;
            fVar147 = (fVar45 - fVar153 * fVar147) * fVar147 + fVar147;
            fVar116 = (fVar64 - fVar134 * fVar116) * fVar116 + fVar116;
            fVar138 = (fVar137 - auVar130._8_4_ * fVar138) * fVar138 + fVar138;
            fVar139 = (fVar67 - auVar130._12_4_ * fVar139) * fVar139 + fVar139;
            fVar135 = fVar135 * fVar147;
            fVar125 = fVar125 * fVar116;
            fVar126 = fVar126 * fVar138;
            fVar127 = fVar127 * fVar139;
            local_10e8[0] = fVar135;
            local_10e8[1] = fVar125;
            local_10e8[2] = fVar126;
            local_10e8[3] = fVar127;
            auVar90._0_4_ = tNear.field_0.v[0] * fVar147;
            auVar90._4_4_ = tNear.field_0.v[1] * fVar116;
            auVar90._8_4_ = tNear.field_0.v[2] * fVar138;
            auVar90._12_4_ = tNear.field_0.v[3] * fVar139;
            auVar123 = minps(auVar90,_DAT_01feca10);
            auVar110._0_4_ = fVar147 * fVar154;
            auVar110._4_4_ = fVar116 * fVar71;
            auVar110._8_4_ = fVar138 * fVar81;
            auVar110._12_4_ = fVar139 * fVar83;
            auVar112 = minps(auVar110,_DAT_01feca10);
            auVar122._0_4_ = fVar45 - auVar123._0_4_;
            auVar122._4_4_ = fVar64 - auVar123._4_4_;
            auVar122._8_4_ = fVar137 - auVar123._8_4_;
            auVar122._12_4_ = fVar67 - auVar123._12_4_;
            auVar132._0_4_ = fVar45 - auVar112._0_4_;
            auVar132._4_4_ = fVar64 - auVar112._4_4_;
            auVar132._8_4_ = fVar137 - auVar112._8_4_;
            auVar132._12_4_ = fVar67 - auVar112._12_4_;
            local_1108 = blendvps(auVar123,auVar122,local_10a8);
            local_10f8 = blendvps(auVar112,auVar132,local_10a8);
            local_10c8 = local_1278;
            uStack_10c0 = CONCAT44(fVar98,fVar95);
            auVar52._8_4_ = valid.field_0.i[2];
            auVar52._0_8_ = valid.field_0._0_8_;
            auVar52._12_4_ = valid.field_0.i[3];
            auVar11._4_4_ = fVar125;
            auVar11._0_4_ = fVar135;
            auVar11._8_4_ = fVar126;
            auVar11._12_4_ = fVar127;
            auVar112 = blendvps(_DAT_01feb9f0,auVar11,auVar52);
            auVar102._4_4_ = auVar112._0_4_;
            auVar102._0_4_ = auVar112._4_4_;
            auVar102._8_4_ = auVar112._12_4_;
            auVar102._12_4_ = auVar112._8_4_;
            auVar123 = minps(auVar102,auVar112);
            auVar53._0_8_ = auVar123._8_8_;
            auVar53._8_4_ = auVar123._0_4_;
            auVar53._12_4_ = auVar123._4_4_;
            auVar123 = minps(auVar53,auVar123);
            auVar54._0_8_ =
                 CONCAT44(-(uint)(auVar123._4_4_ == auVar112._4_4_ && bVar18),
                          -(uint)(auVar123._0_4_ == auVar112._0_4_ && bVar17));
            auVar54._8_4_ = -(uint)(auVar123._8_4_ == auVar112._8_4_ && bVar16);
            auVar54._12_4_ = -(uint)(auVar123._12_4_ == auVar112._12_4_ && bVar15);
            iVar24 = movmskps((int)context,auVar54);
            aVar72 = valid.field_0;
            if (iVar24 != 0) {
              aVar72.i[2] = auVar54._8_4_;
              aVar72._0_8_ = auVar54._0_8_;
              aVar72.i[3] = auVar54._12_4_;
            }
            uVar25 = movmskps(iVar24,(undefined1  [16])aVar72);
            uVar36 = CONCAT44(uVar26,uVar25);
            pGVar37 = (Geometry *)0x0;
            if (uVar36 != 0) {
              for (; (uVar36 >> (long)pGVar37 & 1) == 0;
                  pGVar37 = (Geometry *)((long)&(pGVar37->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
LAB_0027c7d5:
            uVar44 = *(uint *)(lVar1 + 0xc0 + (long)pGVar37 * 4);
            pGVar28 = (pSVar8->geometries).items[uVar44].ptr;
            if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[(long)pGVar37] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar25 = *(undefined4 *)(local_1108 + (long)pGVar37 * 4);
                fVar153 = local_10e8[(long)&pGVar37[-1].field_0x5c];
                *(float *)(ray + k * 4 + 0x80) = local_10e8[(long)pGVar37];
                *(float *)(ray + k * 4 + 0xc0) = local_10d8[(long)pGVar37];
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)((long)&local_10c8 + (long)pGVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)(local_10b8 + (long)pGVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar25;
                *(float *)(ray + k * 4 + 0x100) = fVar153;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_11a8 + (long)pGVar37 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar44;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar44 = context->user->instPrimID[0];
                *(uint *)(ray + k * 4 + 0x140) = uVar44;
                goto LAB_0027c480;
              }
              local_1198 = fVar135;
              fStack_1194 = fVar125;
              fStack_1190 = fVar126;
              fStack_118c = fVar127;
              local_1068 = *(undefined4 *)(local_1108 + (long)pGVar37 * 4);
              local_1058 = local_10e8[(long)&pGVar37[-1].field_0x5c];
              local_1098._4_4_ = local_10d8[(long)pGVar37];
              local_1088._4_4_ = *(undefined4 *)((long)&local_10c8 + (long)pGVar37 * 4);
              local_1038._4_4_ = uVar44;
              local_1038._0_4_ = uVar44;
              local_1038._8_4_ = uVar44;
              local_1038._12_4_ = uVar44;
              uVar25 = *(undefined4 *)((long)&local_11a8 + (long)pGVar37 * 4);
              local_1048._4_4_ = uVar25;
              local_1048._0_4_ = uVar25;
              local_1048._8_4_ = uVar25;
              local_1048._12_4_ = uVar25;
              uVar25 = *(undefined4 *)(local_10b8 + (long)pGVar37 * 4);
              local_1078._4_4_ = uVar25;
              local_1078._0_4_ = uVar25;
              local_1078._8_4_ = uVar25;
              local_1078._12_4_ = uVar25;
              local_1098._0_4_ = local_1098._4_4_;
              fStack_1090 = (float)local_1098._4_4_;
              fStack_108c = (float)local_1098._4_4_;
              local_1088._0_4_ = local_1088._4_4_;
              local_1088._8_4_ = local_1088._4_4_;
              local_1088._12_4_ = local_1088._4_4_;
              uStack_1064 = local_1068;
              uStack_1060 = local_1068;
              uStack_105c = local_1068;
              fStack_1054 = local_1058;
              fStack_1050 = local_1058;
              fStack_104c = local_1058;
              local_1028 = context->user->instID[0];
              uStack_1024 = local_1028;
              uStack_1020 = local_1028;
              uStack_101c = local_1028;
              local_1018 = context->user->instPrimID[0];
              uStack_1014 = local_1018;
              uStack_1010 = local_1018;
              uStack_100c = local_1018;
              uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_10e8[(long)pGVar37];
              local_1218 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
              uStack_1210 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
              args.valid = (int *)&local_1218;
              args.geometryUserPtr = pGVar28->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1098;
              args.N = 4;
              local_1208 = lVar30;
              local_1200 = uVar35;
              local_11f8 = uVar34;
              local_11f0 = uVar33;
              local_11e8 = pSVar38;
              args.ray = (RTCRayN *)ray;
              if (pGVar28->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar28->intersectionFilterN)(&args);
              }
              auVar19._8_8_ = uStack_1210;
              auVar19._0_8_ = local_1218;
              if (auVar19 == (undefined1  [16])0x0) {
                auVar73._8_4_ = 0xffffffff;
                auVar73._0_8_ = 0xffffffffffffffff;
                auVar73._12_4_ = 0xffffffff;
                auVar73 = auVar73 ^ _DAT_01febe20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar28->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var9)(&args);
                }
                auVar20._8_8_ = uStack_1210;
                auVar20._0_8_ = local_1218;
                auVar55._0_4_ = -(uint)((int)local_1218 == 0);
                auVar55._4_4_ = -(uint)((int)((ulong)local_1218 >> 0x20) == 0);
                auVar55._8_4_ = -(uint)((int)uStack_1210 == 0);
                auVar55._12_4_ = -(uint)((int)((ulong)uStack_1210 >> 0x20) == 0);
                auVar73 = auVar55 ^ _DAT_01febe20;
                if (auVar20 != (undefined1  [16])0x0) {
                  auVar123 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar55);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar123;
                }
              }
              if ((_DAT_01fecb20 & auVar73) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar25;
              }
              valid.field_0.v[(long)pGVar37] = 0.0;
              fVar153 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(fStack_1194 <= fVar153) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1198 <= fVar153) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(fStack_1190 <= fVar153) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fStack_118c <= fVar153) & valid.field_0.i[3];
              pGVar28 = pGVar37;
              lVar30 = local_1208;
              uVar33 = local_11f0;
              uVar34 = local_11f8;
              uVar35 = local_1200;
              pSVar38 = local_11e8;
              fVar135 = local_1198;
              fVar125 = fStack_1194;
              fVar126 = fStack_1190;
              fVar127 = fStack_118c;
            }
            uVar44 = movmskps((int)pGVar28,(undefined1  [16])valid.field_0);
            if (uVar44 == 0) goto LAB_0027c480;
            auVar12._4_4_ = fVar125;
            auVar12._0_4_ = fVar135;
            auVar12._8_4_ = fVar126;
            auVar12._12_4_ = fVar127;
            auVar112 = blendvps(_DAT_01feb9f0,auVar12,(undefined1  [16])valid.field_0);
            auVar103._4_4_ = auVar112._0_4_;
            auVar103._0_4_ = auVar112._4_4_;
            auVar103._8_4_ = auVar112._12_4_;
            auVar103._12_4_ = auVar112._8_4_;
            auVar123 = minps(auVar103,auVar112);
            auVar74._0_8_ = auVar123._8_8_;
            auVar74._8_4_ = auVar123._0_4_;
            auVar74._12_4_ = auVar123._4_4_;
            auVar123 = minps(auVar74,auVar123);
            auVar75._0_8_ =
                 CONCAT44(-(uint)(auVar123._4_4_ == auVar112._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar123._0_4_ == auVar112._0_4_) & valid.field_0._0_4_);
            auVar75._8_4_ = -(uint)(auVar123._8_4_ == auVar112._8_4_) & valid.field_0._8_4_;
            auVar75._12_4_ = -(uint)(auVar123._12_4_ == auVar112._12_4_) & valid.field_0._12_4_;
            iVar24 = movmskps(uVar44,auVar75);
            aVar56 = valid.field_0;
            if (iVar24 != 0) {
              aVar56.i[2] = auVar75._8_4_;
              aVar56._0_8_ = auVar75._0_8_;
              aVar56.i[3] = auVar75._12_4_;
            }
            uVar25 = movmskps(iVar24,(undefined1  [16])aVar56);
            uVar36 = CONCAT44((int)((ulong)pGVar28 >> 0x20),uVar25);
            pGVar37 = (Geometry *)0x0;
            if (uVar36 != 0) {
              for (; (uVar36 >> (long)pGVar37 & 1) == 0;
                  pGVar37 = (Geometry *)((long)&(pGVar37->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            goto LAB_0027c7d5;
          }
        }
LAB_0027c480:
        fVar116 = *(float *)(lVar1 + 0x60);
        fVar125 = *(float *)(lVar1 + 100);
        fVar126 = *(float *)(lVar1 + 0x68);
        fVar127 = *(float *)(lVar1 + 0x6c);
        fVar71 = fVar116 - *(float *)(lVar1 + 0x90);
        fVar81 = fVar125 - *(float *)(lVar1 + 0x94);
        fVar83 = fVar126 - *(float *)(lVar1 + 0x98);
        fVar85 = fVar127 - *(float *)(lVar1 + 0x9c);
        fVar135 = *(float *)(lVar1 + 0x70);
        fVar137 = *(float *)(lVar1 + 0x74);
        fVar138 = *(float *)(lVar1 + 0x78);
        fVar139 = *(float *)(lVar1 + 0x7c);
        fVar43 = fVar135 - *(float *)(lVar1 + 0xa0);
        fVar62 = fVar137 - *(float *)(lVar1 + 0xa4);
        fVar65 = fVar138 - *(float *)(lVar1 + 0xa8);
        fVar68 = fVar139 - *(float *)(lVar1 + 0xac);
        fVar45 = *(float *)(lVar1 + 0x80);
        fVar64 = *(float *)(lVar1 + 0x84);
        fVar67 = *(float *)(lVar1 + 0x88);
        fVar70 = *(float *)(lVar1 + 0x8c);
        fVar158 = fVar45 - *(float *)(lVar1 + 0xb0);
        fVar159 = fVar64 - *(float *)(lVar1 + 0xb4);
        fVar160 = fVar67 - *(float *)(lVar1 + 0xb8);
        fVar161 = fVar70 - *(float *)(lVar1 + 0xbc);
        fVar88 = *(float *)(lVar1 + 0x30) - fVar116;
        fVar94 = *(float *)(lVar1 + 0x34) - fVar125;
        fVar97 = *(float *)(lVar1 + 0x38) - fVar126;
        fVar100 = *(float *)(lVar1 + 0x3c) - fVar127;
        fVar140 = *(float *)(lVar1 + 0x40) - fVar135;
        fVar141 = *(float *)(lVar1 + 0x44) - fVar137;
        fVar142 = *(float *)(lVar1 + 0x48) - fVar138;
        fVar143 = *(float *)(lVar1 + 0x4c) - fVar139;
        fVar144 = *(float *)(lVar1 + 0x50) - fVar45;
        fVar145 = *(float *)(lVar1 + 0x54) - fVar64;
        fVar146 = *(float *)(lVar1 + 0x58) - fVar67;
        fVar148 = *(float *)(lVar1 + 0x5c) - fVar70;
        local_10d8[0] = fVar158 * fVar140 - fVar43 * fVar144;
        local_10d8[1] = fVar159 * fVar141 - fVar62 * fVar145;
        local_10d8[2] = fVar160 * fVar142 - fVar65 * fVar146;
        local_10d8[3] = fVar161 * fVar143 - fVar68 * fVar148;
        fVar153 = *(float *)(ray + k * 4);
        fVar134 = *(float *)(ray + k * 4 + 0x10);
        fVar147 = *(float *)(ray + k * 4 + 0x40);
        fVar154 = *(float *)(ray + k * 4 + 0x50);
        fVar116 = fVar116 - fVar153;
        fVar125 = fVar125 - fVar153;
        fVar126 = fVar126 - fVar153;
        fVar127 = fVar127 - fVar153;
        fVar135 = fVar135 - fVar134;
        fVar137 = fVar137 - fVar134;
        fVar138 = fVar138 - fVar134;
        fVar139 = fVar139 - fVar134;
        fVar162 = fVar116 * fVar154 - fVar135 * fVar147;
        fVar163 = fVar125 * fVar154 - fVar137 * fVar147;
        fVar164 = fVar126 * fVar154 - fVar138 * fVar147;
        fVar165 = fVar127 * fVar154 - fVar139 * fVar147;
        fVar86 = fVar71 * fVar144 - fVar158 * fVar88;
        fVar92 = fVar81 * fVar145 - fVar159 * fVar94;
        fVar95 = fVar83 * fVar146 - fVar160 * fVar97;
        fVar98 = fVar85 * fVar148 - fVar161 * fVar100;
        fVar153 = *(float *)(ray + k * 4 + 0x20);
        fVar134 = *(float *)(ray + k * 4 + 0x60);
        fVar45 = fVar45 - fVar153;
        fVar64 = fVar64 - fVar153;
        fVar67 = fVar67 - fVar153;
        fVar70 = fVar70 - fVar153;
        fVar166 = fVar45 * fVar147 - fVar116 * fVar134;
        fVar167 = fVar64 * fVar147 - fVar125 * fVar134;
        fVar168 = fVar67 * fVar147 - fVar126 * fVar134;
        fVar169 = fVar70 * fVar147 - fVar127 * fVar134;
        local_10b8._0_4_ = fVar43 * fVar88 - fVar71 * fVar140;
        local_10b8._4_4_ = fVar62 * fVar94 - fVar81 * fVar141;
        fStack_10b0 = fVar65 * fVar97 - fVar83 * fVar142;
        fStack_10ac = fVar68 * fVar100 - fVar85 * fVar143;
        fVar153 = fVar135 * fVar134 - fVar45 * fVar154;
        fVar149 = fVar137 * fVar134 - fVar64 * fVar154;
        fVar150 = fVar138 * fVar134 - fVar67 * fVar154;
        fVar151 = fVar139 * fVar134 - fVar70 * fVar154;
        local_1278 = CONCAT44(fVar92,fVar86);
        fVar152 = fVar147 * local_10d8[0] + fVar154 * fVar86 + fVar134 * (float)local_10b8._0_4_;
        fVar155 = fVar147 * local_10d8[1] + fVar154 * fVar92 + fVar134 * (float)local_10b8._4_4_;
        fVar156 = fVar147 * local_10d8[2] + fVar154 * fVar95 + fVar134 * fStack_10b0;
        fVar157 = fVar147 * local_10d8[3] + fVar154 * fVar98 + fVar134 * fStack_10ac;
        uVar63 = (uint)fVar152 & 0x80000000;
        uVar66 = (uint)fVar155 & 0x80000000;
        uVar69 = (uint)fVar156 & 0x80000000;
        uVar87 = (uint)fVar157 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar88 * fVar153 + fVar140 * fVar166 + fVar144 * fVar162) ^ uVar63;
        tNear.field_0.i[1] =
             (uint)(fVar94 * fVar149 + fVar141 * fVar167 + fVar145 * fVar163) ^ uVar66;
        tNear.field_0.i[2] =
             (uint)(fVar97 * fVar150 + fVar142 * fVar168 + fVar146 * fVar164) ^ uVar69;
        tNear.field_0.i[3] =
             (uint)(fVar100 * fVar151 + fVar143 * fVar169 + fVar148 * fVar165) ^ uVar87;
        fVar147 = (float)((uint)(fVar153 * fVar71 + fVar166 * fVar43 + fVar162 * fVar158) ^ uVar63);
        fVar154 = (float)((uint)(fVar149 * fVar81 + fVar167 * fVar62 + fVar163 * fVar159) ^ uVar66);
        fVar71 = (float)((uint)(fVar150 * fVar83 + fVar168 * fVar65 + fVar164 * fVar160) ^ uVar69);
        fVar81 = (float)((uint)(fVar151 * fVar85 + fVar169 * fVar68 + fVar165 * fVar161) ^ uVar87);
        auVar121._4_4_ = -(uint)(0.0 <= tNear.field_0.v[1]);
        auVar121._0_4_ = -(uint)(0.0 <= tNear.field_0.v[0]);
        auVar121._8_4_ = -(uint)(0.0 <= tNear.field_0.v[2]);
        auVar121._12_4_ = -(uint)(0.0 <= tNear.field_0.v[3]);
        fVar153 = ABS(fVar152);
        fVar134 = ABS(fVar155);
        auVar131._0_8_ = CONCAT44(fVar155,fVar152) & 0x7fffffff7fffffff;
        auVar131._8_4_ = ABS(fVar156);
        auVar131._12_4_ = ABS(fVar157);
        bVar16 = ((0.0 <= fVar147 && 0.0 <= tNear.field_0.v[0]) && fVar152 != 0.0) &&
                 tNear.field_0.v[0] + fVar147 <= fVar153;
        auVar136._0_4_ = -(uint)bVar16;
        bVar18 = ((0.0 <= fVar154 && 0.0 <= tNear.field_0.v[1]) && fVar155 != 0.0) &&
                 tNear.field_0.v[1] + fVar154 <= fVar134;
        auVar136._4_4_ = -(uint)bVar18;
        bVar17 = ((0.0 <= fVar71 && 0.0 <= tNear.field_0.v[2]) && fVar156 != 0.0) &&
                 tNear.field_0.v[2] + fVar71 <= auVar131._8_4_;
        auVar136._8_4_ = -(uint)bVar17;
        bVar15 = ((0.0 <= fVar81 && 0.0 <= tNear.field_0.v[3]) && fVar157 != 0.0) &&
                 tNear.field_0.v[3] + fVar81 <= auVar131._12_4_;
        auVar136._12_4_ = -(uint)bVar15;
        iVar24 = movmskps(uVar44,auVar136);
        if (iVar24 != 0) {
          fVar135 = (float)(uVar63 ^ (uint)(fVar116 * local_10d8[0] +
                                           fVar135 * fVar86 + fVar45 * (float)local_10b8._0_4_));
          fVar137 = (float)(uVar66 ^ (uint)(fVar125 * local_10d8[1] +
                                           fVar137 * fVar92 + fVar64 * (float)local_10b8._4_4_));
          fVar126 = (float)(uVar69 ^ (uint)(fVar126 * local_10d8[2] +
                                           fVar138 * fVar95 + fVar67 * fStack_10b0));
          fVar127 = (float)(uVar87 ^ (uint)(fVar127 * local_10d8[3] +
                                           fVar139 * fVar98 + fVar70 * fStack_10ac));
          fVar116 = *(float *)(ray + k * 4 + 0x30);
          fVar125 = *(float *)(ray + k * 4 + 0x80);
          bVar16 = (fVar135 <= fVar125 * fVar153 && fVar116 * fVar153 < fVar135) && bVar16;
          bVar18 = (fVar137 <= fVar125 * fVar134 && fVar116 * fVar134 < fVar137) && bVar18;
          valid.field_0._0_8_ = CONCAT44(-(uint)bVar18,-(uint)bVar16);
          bVar17 = (fVar126 <= fVar125 * auVar131._8_4_ && fVar116 * auVar131._8_4_ < fVar126) &&
                   bVar17;
          valid.field_0.i[2] = -(uint)bVar17;
          bVar15 = (fVar127 <= fVar125 * auVar131._12_4_ && fVar116 * auVar131._12_4_ < fVar127) &&
                   bVar15;
          valid.field_0.i[3] = -(uint)bVar15;
          iVar24 = movmskps(iVar24,(undefined1  [16])valid.field_0);
          if (iVar24 != 0) {
            local_10a8._8_8_ = uStack_1000;
            local_10a8._0_8_ = local_1008;
            pSVar8 = context->scene;
            auVar123 = rcpps(auVar121,auVar131);
            fVar116 = auVar123._0_4_;
            fVar125 = auVar123._4_4_;
            fVar139 = auVar123._8_4_;
            fVar45 = auVar123._12_4_;
            fVar64 = (float)DAT_01feca10;
            fVar67 = DAT_01feca10._4_4_;
            fVar70 = DAT_01feca10._12_4_;
            fVar138 = DAT_01feca10._8_4_;
            fVar116 = (fVar64 - fVar153 * fVar116) * fVar116 + fVar116;
            fVar125 = (fVar67 - fVar134 * fVar125) * fVar125 + fVar125;
            fVar139 = (fVar138 - auVar131._8_4_ * fVar139) * fVar139 + fVar139;
            fVar45 = (fVar70 - auVar131._12_4_ * fVar45) * fVar45 + fVar45;
            fVar135 = fVar135 * fVar116;
            fVar137 = fVar137 * fVar125;
            fVar126 = fVar126 * fVar139;
            fVar127 = fVar127 * fVar45;
            local_10e8[0] = fVar135;
            local_10e8[1] = fVar137;
            local_10e8[2] = fVar126;
            local_10e8[3] = fVar127;
            auVar91._0_4_ = tNear.field_0.v[0] * fVar116;
            auVar91._4_4_ = tNear.field_0.v[1] * fVar125;
            auVar91._8_4_ = tNear.field_0.v[2] * fVar139;
            auVar91._12_4_ = tNear.field_0.v[3] * fVar45;
            auVar123 = minps(auVar91,_DAT_01feca10);
            auVar111._0_4_ = fVar116 * fVar147;
            auVar111._4_4_ = fVar125 * fVar154;
            auVar111._8_4_ = fVar139 * fVar71;
            auVar111._12_4_ = fVar45 * fVar81;
            auVar112 = minps(auVar111,_DAT_01feca10);
            auVar124._0_4_ = fVar64 - auVar123._0_4_;
            auVar124._4_4_ = fVar67 - auVar123._4_4_;
            auVar124._8_4_ = fVar138 - auVar123._8_4_;
            auVar124._12_4_ = fVar70 - auVar123._12_4_;
            auVar133._0_4_ = fVar64 - auVar112._0_4_;
            auVar133._4_4_ = fVar67 - auVar112._4_4_;
            auVar133._8_4_ = fVar138 - auVar112._8_4_;
            auVar133._12_4_ = fVar70 - auVar112._12_4_;
            local_1108 = blendvps(auVar123,auVar124,local_10a8);
            local_10f8 = blendvps(auVar112,auVar133,local_10a8);
            local_10c8 = local_1278;
            uStack_10c0 = CONCAT44(fVar98,fVar95);
            auVar57._8_4_ = valid.field_0.i[2];
            auVar57._0_8_ = valid.field_0._0_8_;
            auVar57._12_4_ = valid.field_0.i[3];
            auVar13._4_4_ = fVar137;
            auVar13._0_4_ = fVar135;
            auVar13._8_4_ = fVar126;
            auVar13._12_4_ = fVar127;
            auVar112 = blendvps(_DAT_01feb9f0,auVar13,auVar57);
            auVar104._4_4_ = auVar112._0_4_;
            auVar104._0_4_ = auVar112._4_4_;
            auVar104._8_4_ = auVar112._12_4_;
            auVar104._12_4_ = auVar112._8_4_;
            auVar123 = minps(auVar104,auVar112);
            auVar58._0_8_ = auVar123._8_8_;
            auVar58._8_4_ = auVar123._0_4_;
            auVar58._12_4_ = auVar123._4_4_;
            auVar123 = minps(auVar58,auVar123);
            auVar59._0_8_ =
                 CONCAT44(-(uint)(auVar123._4_4_ == auVar112._4_4_ && bVar18),
                          -(uint)(auVar123._0_4_ == auVar112._0_4_ && bVar16));
            auVar59._8_4_ = -(uint)(auVar123._8_4_ == auVar112._8_4_ && bVar17);
            auVar59._12_4_ = -(uint)(auVar123._12_4_ == auVar112._12_4_ && bVar15);
            iVar24 = movmskps((int)context,auVar59);
            aVar76 = valid.field_0;
            if (iVar24 != 0) {
              aVar76.i[2] = auVar59._8_4_;
              aVar76._0_8_ = auVar59._0_8_;
              aVar76.i[3] = auVar59._12_4_;
            }
            uVar25 = movmskps(iVar24,(undefined1  [16])aVar76);
            uVar36 = CONCAT44(uVar26,uVar25);
            pGVar37 = (Geometry *)0x0;
            if (uVar36 != 0) {
              for (; (uVar36 >> (long)pGVar37 & 1) == 0;
                  pGVar37 = (Geometry *)((long)&(pGVar37->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
LAB_0027cd76:
            uVar44 = *(uint *)(lVar1 + 0xc0 + (long)pGVar37 * 4);
            pGVar28 = (pSVar8->geometries).items[uVar44].ptr;
            if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[(long)pGVar37] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar26 = *(undefined4 *)(local_1108 + (long)pGVar37 * 4);
                fVar153 = local_10e8[(long)&pGVar37[-1].field_0x5c];
                *(float *)(ray + k * 4 + 0x80) = local_10e8[(long)pGVar37];
                *(float *)(ray + k * 4 + 0xc0) = local_10d8[(long)pGVar37];
                *(undefined4 *)(ray + k * 4 + 0xd0) =
                     *(undefined4 *)((long)&local_10c8 + (long)pGVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)(local_10b8 + (long)pGVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar26;
                *(float *)(ray + k * 4 + 0x100) = fVar153;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_11a8 + (long)pGVar37 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar44;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0027c63d;
              }
              local_1198 = fVar135;
              fStack_1194 = fVar137;
              fStack_1190 = fVar126;
              fStack_118c = fVar127;
              local_1068 = *(undefined4 *)(local_1108 + (long)pGVar37 * 4);
              local_1058 = local_10e8[(long)&pGVar37[-1].field_0x5c];
              fVar153 = local_10d8[(long)pGVar37];
              uVar26 = *(undefined4 *)((long)&local_10c8 + (long)pGVar37 * 4);
              local_1038._4_4_ = uVar44;
              local_1038._0_4_ = uVar44;
              local_1038._8_4_ = uVar44;
              local_1038._12_4_ = uVar44;
              uVar25 = *(undefined4 *)((long)&local_11a8 + (long)pGVar37 * 4);
              local_1048._4_4_ = uVar25;
              local_1048._0_4_ = uVar25;
              local_1048._8_4_ = uVar25;
              local_1048._12_4_ = uVar25;
              local_1098._4_4_ = fVar153;
              local_1098._0_4_ = fVar153;
              fStack_1090 = fVar153;
              fStack_108c = fVar153;
              local_1088._4_4_ = uVar26;
              local_1088._0_4_ = uVar26;
              local_1088._8_4_ = uVar26;
              local_1088._12_4_ = uVar26;
              uVar26 = *(undefined4 *)(local_10b8 + (long)pGVar37 * 4);
              local_1078._4_4_ = uVar26;
              local_1078._0_4_ = uVar26;
              local_1078._8_4_ = uVar26;
              local_1078._12_4_ = uVar26;
              uStack_1064 = local_1068;
              uStack_1060 = local_1068;
              uStack_105c = local_1068;
              fStack_1054 = local_1058;
              fStack_1050 = local_1058;
              fStack_104c = local_1058;
              local_1028 = context->user->instID[0];
              uStack_1024 = local_1028;
              uStack_1020 = local_1028;
              uStack_101c = local_1028;
              local_1018 = context->user->instPrimID[0];
              uStack_1014 = local_1018;
              uStack_1010 = local_1018;
              uStack_100c = local_1018;
              uVar26 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_10e8[(long)pGVar37];
              local_1218 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
              uStack_1210 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
              args.valid = (int *)&local_1218;
              args.geometryUserPtr = pGVar28->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1098;
              args.N = 4;
              local_1208 = lVar30;
              local_1200 = uVar35;
              local_11f8 = uVar34;
              local_11f0 = uVar33;
              local_11e8 = pSVar38;
              args.ray = (RTCRayN *)ray;
              if (pGVar28->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar28->intersectionFilterN)(&args);
              }
              auVar21._8_8_ = uStack_1210;
              auVar21._0_8_ = local_1218;
              if (auVar21 == (undefined1  [16])0x0) {
                auVar77._8_4_ = 0xffffffff;
                auVar77._0_8_ = 0xffffffffffffffff;
                auVar77._12_4_ = 0xffffffff;
                auVar77 = auVar77 ^ _DAT_01febe20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar28->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var9)(&args);
                }
                auVar22._8_8_ = uStack_1210;
                auVar22._0_8_ = local_1218;
                auVar60._0_4_ = -(uint)((int)local_1218 == 0);
                auVar60._4_4_ = -(uint)((int)((ulong)local_1218 >> 0x20) == 0);
                auVar60._8_4_ = -(uint)((int)uStack_1210 == 0);
                auVar60._12_4_ = -(uint)((int)((ulong)uStack_1210 >> 0x20) == 0);
                auVar77 = auVar60 ^ _DAT_01febe20;
                if (auVar22 != (undefined1  [16])0x0) {
                  auVar123 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar123;
                  auVar123 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar60);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar123;
                }
              }
              if ((_DAT_01fecb20 & auVar77) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar26;
              }
              valid.field_0.v[(long)pGVar37] = 0.0;
              fVar153 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(fStack_1194 <= fVar153) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1198 <= fVar153) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(fStack_1190 <= fVar153) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fStack_118c <= fVar153) & valid.field_0.i[3];
              pGVar28 = pGVar37;
              lVar30 = local_1208;
              uVar33 = local_11f0;
              uVar34 = local_11f8;
              uVar35 = local_1200;
              pSVar38 = local_11e8;
              fVar135 = local_1198;
              fVar137 = fStack_1194;
              fVar126 = fStack_1190;
              fVar127 = fStack_118c;
            }
            iVar24 = movmskps((int)pGVar28,(undefined1  [16])valid.field_0);
            if (iVar24 == 0) goto LAB_0027c63d;
            auVar14._4_4_ = fVar137;
            auVar14._0_4_ = fVar135;
            auVar14._8_4_ = fVar126;
            auVar14._12_4_ = fVar127;
            auVar112 = blendvps(_DAT_01feb9f0,auVar14,(undefined1  [16])valid.field_0);
            auVar105._4_4_ = auVar112._0_4_;
            auVar105._0_4_ = auVar112._4_4_;
            auVar105._8_4_ = auVar112._12_4_;
            auVar105._12_4_ = auVar112._8_4_;
            auVar123 = minps(auVar105,auVar112);
            auVar78._0_8_ = auVar123._8_8_;
            auVar78._8_4_ = auVar123._0_4_;
            auVar78._12_4_ = auVar123._4_4_;
            auVar123 = minps(auVar78,auVar123);
            auVar79._0_8_ =
                 CONCAT44(-(uint)(auVar123._4_4_ == auVar112._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar123._0_4_ == auVar112._0_4_) & valid.field_0._0_4_);
            auVar79._8_4_ = -(uint)(auVar123._8_4_ == auVar112._8_4_) & valid.field_0._8_4_;
            auVar79._12_4_ = -(uint)(auVar123._12_4_ == auVar112._12_4_) & valid.field_0._12_4_;
            iVar24 = movmskps(iVar24,auVar79);
            aVar61 = valid.field_0;
            if (iVar24 != 0) {
              aVar61.i[2] = auVar79._8_4_;
              aVar61._0_8_ = auVar79._0_8_;
              aVar61.i[3] = auVar79._12_4_;
            }
            uVar26 = movmskps(iVar24,(undefined1  [16])aVar61);
            uVar36 = CONCAT44((int)((ulong)pGVar28 >> 0x20),uVar26);
            pGVar37 = (Geometry *)0x0;
            if (uVar36 != 0) {
              for (; (uVar36 >> (long)pGVar37 & 1) == 0;
                  pGVar37 = (Geometry *)((long)&(pGVar37->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            goto LAB_0027cd76;
          }
        }
LAB_0027c63d:
        lVar42 = lVar42 + 1;
      } while (lVar42 != lVar30);
    }
    iVar24 = *(int *)(ray + k * 4 + 0x80);
    fVar153 = local_f88;
    fVar134 = fStack_f84;
    fVar147 = fStack_f80;
    fVar154 = fStack_f7c;
    fVar116 = local_f98;
    fVar125 = fStack_f94;
    fVar126 = fStack_f90;
    fVar127 = fStack_f8c;
    fVar135 = local_fa8;
    fVar137 = fStack_fa4;
    fVar138 = fStack_fa0;
    fVar139 = fStack_f9c;
    fVar45 = local_fb8;
    fVar64 = fStack_fb4;
    fVar67 = fStack_fb0;
    fVar70 = fStack_fac;
    iVar80 = iVar24;
    iVar82 = iVar24;
    iVar84 = iVar24;
    iVar106 = local_fe8;
    iVar113 = iStack_fe4;
    iVar114 = iStack_fe0;
    iVar115 = iStack_fdc;
    fVar71 = local_fc8;
    fVar81 = fStack_fc4;
    fVar83 = fStack_fc0;
    fVar85 = fStack_fbc;
    fVar88 = local_fd8;
    fVar94 = fStack_fd4;
    fVar97 = fStack_fd0;
    fVar100 = fStack_fcc;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }